

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureTheFlag.cpp
# Opt level: O0

bool __thiscall anon_unknown.dwarf_339b0::CtfSeeker::clearPathToGoal(CtfSeeker *this)

{
  Vec3 *in_RDI;
  float fVar1;
  float fVar2;
  Vec3 VVar3;
  undefined1 auVar4 [12];
  Vec3 *in_stack_00000050;
  float in_stack_00000058;
  float in_stack_0000005c;
  bool safeToTurnTowardsGoal;
  bool eIsWayBehind;
  CtfSeeker *in_stack_00000060;
  bool eIsBehind;
  float eFront;
  float acrossCorridor;
  Vec3 perp;
  float eForwardDistance;
  bool inCorridor;
  float alongCorridor;
  Vec3 eOffset;
  Vec3 eFuture;
  float timeEstimate;
  float eDistance;
  CtfEnemy *e;
  int i;
  bool xxxReturn;
  bool goalIsAside;
  Vec3 goalDirection;
  float goalDistance;
  Vec3 goalOffset;
  float behindThreshold;
  float sideThreshold;
  Color *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  float in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe28;
  float in_stack_fffffffffffffe2c;
  Vec3 *in_stack_fffffffffffffe30;
  AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *this_00;
  Vec3 *in_stack_fffffffffffffe40;
  float in_stack_fffffffffffffea4;
  Vec3 *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  Vec3 local_130;
  float local_124;
  byte local_11d;
  float local_11c;
  Vec3 local_118;
  undefined1 local_108 [12];
  undefined1 local_f8 [12];
  Vec3 local_ec;
  undefined1 local_e0 [12];
  undefined1 local_d0 [12];
  float local_c4;
  undefined1 local_c0 [12];
  undefined1 local_b0 [12];
  undefined1 local_a0 [12];
  undefined1 local_90 [12];
  float local_84;
  long *local_80;
  int local_78;
  byte local_72;
  byte local_71;
  Vec3 local_70;
  Vec3 local_60;
  float local_54;
  Vec3 local_50;
  undefined1 local_40 [12];
  undefined1 local_30 [12];
  AbstractLocalSpace local_20;
  float local_18;
  float local_10;
  float local_c;
  
  local_c = (float)(**(code **)(*(long *)in_RDI + 0xc0))();
  local_c = local_c * 8.0;
  local_10 = (float)(**(code **)(*(long *)in_RDI + 0xc0))();
  local_10 = local_10 + local_10;
  local_40 = (**(code **)(*(long *)in_RDI + 0x40))();
  local_30 = local_40;
  local_50 = OpenSteer::Vec3::operator-
                       (in_stack_fffffffffffffe30,
                        (Vec3 *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  local_18 = local_50.z;
  local_20._vptr_AbstractLocalSpace = (_func_int **)local_50._0_8_;
  this_00 = (AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
            &stack0xffffffffffffffe0;
  local_54 = OpenSteer::Vec3::length((Vec3 *)0x12e7cf);
  VVar3 = OpenSteer::Vec3::operator/((Vec3 *)this_00,in_stack_fffffffffffffe2c);
  local_70._0_8_ = VVar3._0_8_;
  local_60.x = local_70.x;
  local_60.y = local_70.y;
  local_70.z = VVar3.z;
  local_60.z = local_70.z;
  local_70 = VVar3;
  local_71 = OpenSteer::
             SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
             ::isAside((SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                        *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                       in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
  local_72 = 1;
  for (local_78 = 0; local_78 < 4; local_78 = local_78 + 1) {
    local_80 = *(long **)((anonymous_namespace)::ctfEnemies + (long)local_78 * 8);
    auVar4 = (**(code **)(*(long *)in_RDI + 0x40))();
    local_a0 = auVar4;
    local_90 = auVar4;
    auVar4 = (**(code **)(*local_80 + 0x40))();
    local_c0 = auVar4;
    local_b0 = auVar4;
    local_84 = OpenSteer::Vec3::distance(in_stack_fffffffffffffe40,in_RDI);
    fVar1 = local_84 * 0.3;
    local_c4 = (float)(**(code **)(*local_80 + 0xd8))();
    local_c4 = fVar1 / local_c4;
    auVar4 = (**(code **)(*local_80 + 0xe8))();
    local_e0 = auVar4;
    local_d0 = auVar4;
    auVar4 = (**(code **)(*(long *)in_RDI + 0x40))();
    local_108 = auVar4;
    local_f8 = auVar4;
    VVar3 = OpenSteer::Vec3::operator-
                      ((Vec3 *)this_00,(Vec3 *)CONCAT44(in_stack_fffffffffffffe2c,fVar1));
    local_118._0_8_ = VVar3._0_8_;
    local_ec.x = local_118.x;
    local_ec.y = local_118.y;
    local_118.z = VVar3.z;
    local_ec.z = local_118.z;
    local_118 = VVar3;
    local_11c = OpenSteer::Vec3::dot(&local_60,&local_ec);
    fVar2 = (float)((uint)in_stack_fffffffffffffe2c & 0xffffff);
    if (-local_10 < local_11c) {
      fVar2 = (float)CONCAT13(local_11c < local_54,SUB43(in_stack_fffffffffffffe2c,0));
    }
    in_stack_fffffffffffffe2c = fVar2;
    local_11d = (byte)((uint)in_stack_fffffffffffffe2c >> 0x18);
    VVar3 = (Vec3)(**(code **)(*(long *)in_RDI + 0x30))();
    local_130 = VVar3;
    local_124 = OpenSteer::Vec3::dot(&local_130,&local_ec);
    (**(code **)(*local_80 + 0xc0))();
    OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
    annotationXZCircle(this_00,in_stack_fffffffffffffe2c,
                       (Vec3 *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       in_stack_fffffffffffffe18,0);
    if ((local_11d & 1) != 0) {
      OpenSteer::Vec3::operator*((Vec3 *)this_00,in_stack_fffffffffffffe2c);
      OpenSteer::Vec3::operator-((Vec3 *)this_00,(Vec3 *)CONCAT44(in_stack_fffffffffffffe2c,fVar1));
      fVar2 = OpenSteer::Vec3::length((Vec3 *)0x12ebc1);
      if (fVar2 < local_c) {
        in_stack_fffffffffffffe24 = local_124;
        fVar2 = (float)(**(code **)(*local_80 + 0xc0))();
        if ((-local_10 <= in_stack_fffffffffffffe24 + fVar2) ||
           (in_stack_fffffffffffffe20 = CONCAT13(1,(int3)in_stack_fffffffffffffe20),
           (local_71 & 1) == 0)) {
          in_stack_fffffffffffffe20 =
               CONCAT13(in_stack_fffffffffffffe24 + fVar2 < local_10 * -2.0,
                        (int3)in_stack_fffffffffffffe20);
        }
        if ((char)((uint)in_stack_fffffffffffffe20 >> 0x18) == '\0') {
          (**(code **)(*(long *)in_RDI + 0x40))();
          in_stack_fffffffffffffe40 = (Vec3 *)(**(code **)(*local_80 + 0x40))();
          OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
          annotationLine(this_00,(Vec3 *)CONCAT44(in_stack_fffffffffffffe2c,fVar1),
                         (Vec3 *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                         in_stack_fffffffffffffe18);
          local_72 = 0;
        }
      }
    }
  }
  clearPathAnnotation(in_stack_00000060,in_stack_0000005c,in_stack_00000058,in_stack_00000050);
  return (bool)(local_72 & 1);
}

Assistant:

bool CtfSeeker::clearPathToGoal (void)
    {
        const float sideThreshold = radius() * 8.0f;
        const float behindThreshold = radius() * 2.0f;

        const Vec3 goalOffset = gHomeBaseCenter - position();
        const float goalDistance = goalOffset.length ();
        const Vec3 goalDirection = goalOffset / goalDistance;

        const bool goalIsAside = isAside (gHomeBaseCenter, 0.5);

        // for annotation: loop over all and save result, instead of early return 
        bool xxxReturn = true;

        // loop over enemies
        for (int i = 0; i < ctfEnemyCount; i++)
        {
            // short name for this enemy
            const CtfEnemy& e = *ctfEnemies[i];
            const float eDistance = Vec3::distance (position(), e.position());
            const float timeEstimate = 0.3f * eDistance / e.speed(); //xxx
            const Vec3 eFuture = e.predictFuturePosition (timeEstimate);
            const Vec3 eOffset = eFuture - position();
            const float alongCorridor = goalDirection.dot (eOffset);
            const bool inCorridor = ((alongCorridor > -behindThreshold) && 
                                     (alongCorridor < goalDistance));
            const float eForwardDistance = forward().dot (eOffset);

            // xxx temp move this up before the conditionals
            annotationXZCircle (e.radius(), eFuture, clearPathColor, 20); //xxx

            // consider as potential blocker if within the corridor
            if (inCorridor)
            {
                const Vec3 perp = eOffset - (goalDirection * alongCorridor);
                const float acrossCorridor = perp.length();
                if (acrossCorridor < sideThreshold)
                {
                    // not a blocker if behind us and we are perp to corridor
                    const float eFront = eForwardDistance + e.radius ();

                    //annotationLine (position, forward*eFront, gGreen); // xxx
                    //annotationLine (e.position, forward*eFront, gGreen); // xxx

                    // xxx
                    // std::ostringstream message;
                    // message << "eFront = " << std::setprecision(2)
                    //         << std::setiosflags(std::ios::fixed) << eFront << std::ends;
                    // draw2dTextAt3dLocation (*message.str(), eFuture, gWhite);

                    const bool eIsBehind = eFront < -behindThreshold;
                    const bool eIsWayBehind = eFront < (-2 * behindThreshold);
                    const bool safeToTurnTowardsGoal =
                        ((eIsBehind && goalIsAside) || eIsWayBehind);

                    if (! safeToTurnTowardsGoal)
                    {
                        // this enemy blocks the path to the goal, so return false
                        annotationLine (position(), e.position(), clearPathColor);
                        // return false;
                        xxxReturn = false;
                    }
                }
            }
        }

        // no enemies found along path, return true to indicate path is clear
        // clearPathAnnotation (sideThreshold, behindThreshold, goalDirection);
        // return true;
        //if (xxxReturn)
            clearPathAnnotation (sideThreshold, behindThreshold, goalDirection);
        return xxxReturn;
    }